

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O2

int __thiscall chrono::ChLoadCustomMultiple::LoadGet_ndof_w(ChLoadCustomMultiple *this)

{
  pointer psVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int i;
  ulong uVar5;
  
  lVar4 = 0;
  uVar5 = 0;
  iVar3 = 0;
  while( true ) {
    psVar1 = (this->loadables).
             super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->loadables).
                      super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar5)
    break;
    iVar2 = (**(code **)(**(long **)((long)&(psVar1->
                                            super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar4) + 0x18))();
    iVar3 = iVar3 + iVar2;
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  }
  return iVar3;
}

Assistant:

int ChLoadCustomMultiple::LoadGet_ndof_w() {
    int ndoftot = 0;
    for (int i = 0; i < loadables.size(); ++i)
        ndoftot += loadables[i]->LoadableGet_ndof_w();
    return ndoftot;
}